

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.cpp
# Opt level: O2

bool __thiscall CSounds::IsPlaying(CSounds *this,int SetId)

{
  uint *puVar1;
  CDataSoundset *pCVar2;
  ISound *pIVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  
  bVar6 = false;
  if ((-1 < SetId) && (bVar6 = false, this->m_WaitForSoundJob == false)) {
    if (SetId < g_pData->m_NumSounds) {
      pCVar2 = g_pData->m_aSounds;
      lVar8 = -1;
      lVar7 = 0;
      do {
        lVar5 = (long)pCVar2[(uint)SetId].m_NumSounds;
        lVar8 = lVar8 + 1;
        bVar6 = lVar8 < lVar5;
        if (lVar5 <= lVar8) {
          return bVar6;
        }
        pIVar3 = ((this->super_CComponent).m_pClient)->m_pSound;
        puVar1 = (uint *)((long)&((pCVar2[(uint)SetId].m_aSounds)->m_Id).m_Id + lVar7);
        lVar7 = lVar7 + 0x10;
        iVar4 = (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])(pIVar3,(ulong)*puVar1);
      } while ((char)iVar4 == '\0');
    }
    else {
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool CSounds::IsPlaying(int SetId)
{
	if(m_WaitForSoundJob || SetId < 0 || SetId >= g_pData->m_NumSounds)
		return false;

	CDataSoundset *pSet = &g_pData->m_aSounds[SetId];
	for(int i = 0; i < pSet->m_NumSounds; i++)
	{
		if(Sound()->IsPlaying(pSet->m_aSounds[i].m_Id))
			return true;
	}
	return false;
}